

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_dpb.c
# Opt level: O3

void h264e_dpb_check(H264eDpb *dpb,EncCpbStatus *cpb)

{
  int iVar1;
  H264eDpbFrm *pHVar2;
  char cVar3;
  ulong uVar4;
  H264eDpbFrm *pHVar5;
  uint uVar6;
  long lVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  uint local_60;
  H264eDpbFrm *local_48;
  
  pHVar2 = dpb->curr;
  if ((h264e_debug._1_1_ & 1) != 0) {
    pHVar5 = dpb->refr;
    _mpp_log_l(4,"h264e_dpb","enter %p\n","h264e_dpb_check",dpb);
    if ((h264e_debug._1_1_ & 1) != 0) {
      _mpp_log_l(4,"h264e_dpb","frm %d refr -> frm %d ready\n","h264e_dpb_check",
                 (ulong)(uint)pHVar2->seq_idx,(ulong)(uint)pHVar5->seq_idx);
    }
  }
  uVar4 = (pHVar2->status).val;
  if ((uVar4 & 0x40) == 0) {
    iVar1 = dpb->used_size;
    uVar6 = dpb->dpb_size;
    if ((h264e_debug._1_1_ & 1) != 0) {
      pcVar8 = "lt";
      if (-1 < (char)uVar4) {
        pcVar8 = "st";
      }
      _mpp_log_l(4,"h264e_dpb","frm %d %s insert dpb used %d max %d\n","h264e_dpb_check",
                 (ulong)(uint)pHVar2->seq_idx,pcVar8,iVar1,uVar6);
      uVar4 = (pHVar2->status).val;
    }
    uVar10 = (ulong)(iVar1 + 1);
    if ((char)uVar4 < '\0') {
      iVar1 = pHVar2->lt_idx;
      dpb->lt_size = dpb->lt_size + 1;
      if (0 < dpb->total_cnt) {
        pHVar5 = dpb->frames;
        lVar7 = 0;
        do {
          if (((pHVar5 != pHVar2) && (*(char *)&pHVar5->field_2 != '\0')) &&
             (uVar4 = (pHVar5->status).val, (uVar4 & 1) != 0)) {
            if ((uVar4 & 0x40) != 0) {
              _mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                         "!tmp->status.is_non_ref","h264e_dpb_check",0x282);
              if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_002385b9;
              uVar4 = (pHVar5->status).val;
            }
            if (((char)uVar4 < '\0') && (pHVar5->lt_idx == iVar1)) {
              *(undefined1 *)&pHVar5->field_2 = 0;
              (pHVar5->status).val = uVar4 & 0xfffffffffffffffe;
              if ((h264e_debug._1_1_ & 1) != 0) {
                _mpp_log_l(4,"h264e_dpb","frm %d lt_idx %d replace %d\n","h264e_dpb_check",
                           (ulong)(uint)pHVar2->seq_idx,(ulong)(uint)pHVar2->lt_idx,pHVar5->slot_idx
                          );
              }
              dpb->lt_size = dpb->lt_size + -1;
              uVar10 = (ulong)((int)uVar10 - 1);
            }
          }
          lVar7 = lVar7 + 1;
          pHVar5 = pHVar5 + 1;
        } while (lVar7 < dpb->total_cnt);
      }
    }
    else {
      dpb->st_size = dpb->st_size + 1;
    }
    if ((int)uVar6 < (int)uVar10) {
      if (((int)uVar6 < dpb->lt_size) &&
         (_mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "dpb->lt_size <= dpb_size","h264e_dpb_check",0x295),
         (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_002385b9;
      do {
        if ((h264e_debug._1_1_ & 1) != 0) {
          _mpp_log_l(4,"h264e_dpb","sliding window cpb proc: st %d lt %d max %d\n","h264e_dpb_check"
                     ,(ulong)(uint)dpb->st_size,(ulong)(uint)dpb->lt_size,uVar6);
        }
        if (dpb->total_cnt < 1) goto LAB_0023840a;
        local_60 = 0x7fffffff;
        lVar7 = 0;
        local_48 = (H264eDpbFrm *)0x0;
        pHVar5 = dpb->frames;
        do {
          if ((h264e_debug._1_1_ & 1) != 0) {
            _mpp_log_l(4,"h264e_dpb","frm %d num %d poc %d\n","h264e_dpb_check",
                       (ulong)(uint)pHVar5->seq_idx,(ulong)(uint)pHVar5->frame_num,pHVar5->poc);
          }
          if ((pHVar5->as_pskip_ref == 0) && ((pHVar5->field_2).on_used != 0)) {
            uVar4 = (pHVar5->status).val;
            cVar3 = (char)uVar4;
            if ((uVar4 & 1) != 0) {
              if ((uVar4 & 0x40) != 0) {
                _mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                           "!tmp->status.is_non_ref","h264e_dpb_check",0x2ad);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_002385b9;
                cVar3 = (char)(pHVar5->status).val;
              }
              if (((-1 < cVar3) && (uVar9 = pHVar5->poc, (int)uVar9 < (int)local_60)) &&
                 (local_60 = uVar9, local_48 = pHVar5, (h264e_debug._1_1_ & 1) != 0)) {
                _mpp_log_l(4,"h264e_dpb","frm %d update smallest poc to %d\n","h264e_dpb_check",
                           (ulong)(uint)pHVar5->seq_idx,(ulong)uVar9);
              }
            }
          }
          lVar7 = lVar7 + 1;
          pHVar5 = pHVar5 + 1;
        } while (lVar7 < dpb->total_cnt);
        if (local_48 == (H264eDpbFrm *)0x0) goto LAB_0023840a;
        if ((h264e_debug._1_1_ & 1) != 0) {
          _mpp_log_l(4,"h264e_dpb","removing frm %d poc %d\n","h264e_dpb_check",
                     (ulong)(uint)local_48->seq_idx,(ulong)(uint)local_48->poc);
        }
        *(undefined1 *)&local_48->field_2 = 0;
        iVar1 = dpb->st_size;
        dpb->st_size = iVar1 + -1;
        if ((iVar1 < 1) &&
           (_mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "dpb->st_size >= 0","h264e_dpb_check",0x2c1), (mpp_debug._3_1_ & 0x10) != 0))
        goto LAB_002385b9;
        uVar9 = (int)uVar10 - 1;
        uVar10 = (ulong)uVar9;
      } while ((int)uVar6 < (int)uVar9);
      dpb->used_size = uVar6;
    }
    else {
LAB_0023840a:
      dpb->used_size = (int)uVar10;
      if ((int)uVar6 < (int)uVar10) {
        _mpp_log_l(2,"h264e_dpb","error found used_size %d > dpb_size %d\n","h264e_dpb_check",uVar10
                   ,(ulong)uVar6);
        _mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "used_size <= dpb_size","h264e_dpb_check",0x2cb);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_002385b9;
      }
    }
  }
  else {
    *(undefined1 *)&pHVar2->field_2 = 0;
    (pHVar2->status).val = uVar4 & 0xfffffffffffffffe;
  }
  if ((h264e_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"h264e_dpb","curr %d done used_size %d\n","h264e_dpb_check",
               (ulong)(uint)pHVar2->seq_idx,(ulong)(uint)dpb->used_size);
  }
  lVar7 = 0;
  uVar6 = 0;
  do {
    pHVar5 = find_cpb_frame(dpb,(EncFrmStatus *)((long)cpb->final + lVar7));
    *(H264eDpbFrm **)((long)dpb->map + lVar7) = pHVar5;
    uVar6 = (uVar6 + 1) - (uint)(pHVar5 == (H264eDpbFrm *)0x0);
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x40);
  if ((h264e_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"h264e_dpb","curr %d cpb final used_size %d vs %d\n","h264e_dpb_check",
               (ulong)(uint)pHVar2->seq_idx,(ulong)uVar6,dpb->used_size);
  }
  if ((dpb->used_size == uVar6) ||
     (_mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "dpb->used_size == used_size","h264e_dpb_check",0x2da),
     (mpp_debug._3_1_ & 0x10) == 0)) {
    if ((h264e_debug._1_1_ & 1) != 0) {
      _mpp_log_l(4,"h264e_dpb","leave %p\n","h264e_dpb_check",dpb);
      return;
    }
    return;
  }
LAB_002385b9:
  abort();
}

Assistant:

void h264e_dpb_check(H264eDpb *dpb, EncCpbStatus *cpb)
{
    H264eDpbFrm *curr = dpb->curr;
    H264eDpbFrm *refr = dpb->refr;
    RK_S32 i;

    h264e_dbg_dpb("enter %p\n", dpb);

    h264e_dbg_dpb("frm %d refr -> frm %d ready\n",
                  curr->seq_idx, refr->seq_idx);

    if (curr->status.is_non_ref) {
        curr->dpb_used = 0;
        curr->status.valid = 0;
    } else {
        /* sliding window process */
        RK_S32 used_size = dpb->used_size;
        RK_S32 dpb_size = dpb->dpb_size;

        h264e_dbg_dpb("frm %d %s insert dpb used %d max %d\n",
                      curr->seq_idx, curr->status.is_lt_ref ? "lt" : "st",
                      used_size, dpb_size);

        used_size++;

        /* replace lt ref with same lt_idx */
        if (curr->status.is_lt_ref) {
            RK_S32 lt_idx = curr->lt_idx;

            dpb->lt_size++;

            for (i = 0; i < dpb->total_cnt; i++) {
                H264eDpbFrm *tmp = &dpb->frames[i];

                if (tmp == curr)
                    continue;

                if (!tmp->dpb_used)
                    continue;

                if (!tmp->status.valid)
                    continue;

                mpp_assert(!tmp->status.is_non_ref);

                if (!tmp->status.is_lt_ref)
                    continue;

                if (tmp->lt_idx == lt_idx) {
                    tmp->dpb_used = 0;
                    tmp->status.valid = 0;
                    h264e_dbg_dpb("frm %d lt_idx %d replace %d\n",
                                  curr->seq_idx, curr->lt_idx, tmp->slot_idx);
                    dpb->lt_size--;
                    used_size--;
                }
            }
        } else {
            dpb->st_size++;
        }

        if (used_size > dpb_size) {
            mpp_assert(dpb->lt_size <= dpb_size);

            while (used_size > dpb_size) {
                RK_S32 small_poc = 0x7fffffff;
                H264eDpbFrm *unref = NULL;

                h264e_dbg_dpb("sliding window cpb proc: st %d lt %d max %d\n",
                              dpb->st_size, dpb->lt_size, dpb_size);

                for (i = 0; i < dpb->total_cnt; i++) {
                    H264eDpbFrm *tmp = &dpb->frames[i];

                    h264e_dbg_dpb("frm %d num %d poc %d\n",
                                  tmp->seq_idx, tmp->frame_num, tmp->poc);

                    if (tmp->as_pskip_ref)
                        continue;

                    if (!tmp->on_used)
                        continue;

                    if (!tmp->status.valid)
                        continue;

                    mpp_assert(!tmp->status.is_non_ref);

                    if (tmp->status.is_lt_ref)
                        continue;

                    if (tmp->poc < small_poc) {
                        unref = tmp;
                        small_poc = tmp->poc;

                        h264e_dbg_dpb("frm %d update smallest poc to %d\n",
                                      tmp->seq_idx, tmp->poc);
                    }
                }

                if (unref) {
                    h264e_dbg_dpb("removing frm %d poc %d\n",
                                  unref->seq_idx, unref->poc);

                    unref->dpb_used = 0;
                    dpb->st_size--;
                    mpp_assert(dpb->st_size >= 0);
                    used_size--;
                } else
                    break;
            }
        }

        dpb->used_size = used_size;
        if (used_size > dpb_size) {
            mpp_err_f("error found used_size %d > dpb_size %d\n", used_size, dpb_size);
            mpp_assert(used_size <= dpb_size);
        }
    }

    h264e_dbg_dpb("curr %d done used_size %d\n", curr->seq_idx, dpb->used_size);

    RK_S32 used_size = 0;
    for (i = 0; i < MAX_CPB_REFS; i++) {
        dpb->map[i] = find_cpb_frame(dpb, &cpb->final[i]);
        if (dpb->map[i])
            used_size++;
    }

    h264e_dbg_dpb("curr %d cpb final used_size %d vs %d\n",
                  curr->seq_idx, used_size, dpb->used_size);
    mpp_assert(dpb->used_size == used_size);

    h264e_dbg_dpb("leave %p\n", dpb);
}